

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  AccelData *pAVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  uint uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  ulong uVar33;
  Geometry *pGVar34;
  RTCIntersectFunctionN p_Var35;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar36;
  uint uVar37;
  ulong uVar38;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar39;
  Geometry *pGVar40;
  ulong uVar41;
  size_t sVar42;
  size_t sVar43;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  undefined8 uVar49;
  vint4 ai;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  float fVar60;
  float fVar66;
  float fVar68;
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined8 uVar72;
  vint4 ai_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  vint4 bi;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_3;
  undefined1 auVar84 [16];
  undefined4 uVar85;
  vint4 ai_2;
  vint4 bi_2;
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar89 [64];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  vint<4> octant;
  undefined1 local_2748 [16];
  vint4 bi_8;
  undefined1 local_2698 [16];
  RTCIntersectFunctionNArguments local_2680;
  Geometry *local_2650;
  undefined8 local_2648;
  RTCIntersectArguments *local_2640;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_2638;
  undefined4 local_2628;
  undefined4 uStack_2624;
  undefined4 uStack_2620;
  undefined4 uStack_261c;
  undefined1 local_2618 [16];
  float local_2608;
  float fStack_2604;
  float fStack_2600;
  float fStack_25fc;
  float local_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float local_25e8;
  float fStack_25e4;
  float fStack_25e0;
  float fStack_25dc;
  undefined1 local_25d8 [16];
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined1 local_2598 [16];
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  undefined1 local_2578 [16];
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar52 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
  auVar65 = vpcmpeqd_avx(auVar52,(undefined1  [16])valid_i->field_0);
  uVar30 = vmovmskps_avx(auVar65);
  if (uVar30 != 0) {
    local_2638 = valid_i->field_0;
    pAVar2 = This->ptr;
    uVar38 = (ulong)(uVar30 & 0xff);
    auVar1 = *(undefined1 (*) [16])(ray + 0x40);
    auVar73._8_4_ = 0x7fffffff;
    auVar73._0_8_ = 0x7fffffff7fffffff;
    auVar73._12_4_ = 0x7fffffff;
    auVar61 = vandps_avx(auVar1,auVar73);
    auVar80._8_4_ = 0x219392ef;
    auVar80._0_8_ = 0x219392ef219392ef;
    auVar80._12_4_ = 0x219392ef;
    auVar61 = vcmpps_avx(auVar61,auVar80,1);
    auVar3 = vblendvps_avx(auVar1,auVar80,auVar61);
    auVar61 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar73);
    auVar61 = vcmpps_avx(auVar61,auVar80,1);
    auVar62 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar80,auVar61);
    auVar61 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar73);
    auVar61 = vcmpps_avx(auVar61,auVar80,1);
    auVar61 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar80,auVar61);
    auVar73 = vrcpps_avx(auVar3);
    auVar81._8_4_ = 0x3f800000;
    auVar81._0_8_ = &DAT_3f8000003f800000;
    auVar81._12_4_ = 0x3f800000;
    auVar3 = vfnmadd213ps_fma(auVar3,auVar73,auVar81);
    local_25b8 = vfmadd132ps_fma(auVar3,auVar73,auVar73);
    auVar93 = ZEXT1664(local_25b8);
    auVar3 = vrcpps_avx(auVar62);
    auVar62 = vfnmadd213ps_fma(auVar62,auVar3,auVar81);
    local_25c8 = vfmadd132ps_fma(auVar62,auVar3,auVar3);
    auVar94 = ZEXT1664(local_25c8);
    auVar3 = vrcpps_avx(auVar61);
    auVar61 = vfnmadd213ps_fma(auVar61,auVar3,auVar81);
    local_25d8 = vfmadd132ps_fma(auVar61,auVar3,auVar3);
    auVar95 = ZEXT1664(local_25d8);
    auVar73 = ZEXT816(0);
    auVar3 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar73);
    local_2618 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar73);
    auVar92 = ZEXT1664(auVar52 ^ auVar65);
    auVar1 = vcmpps_avx(auVar1,auVar73,1);
    auVar61._8_4_ = 1;
    auVar61._0_8_ = 0x100000001;
    auVar61._12_4_ = 1;
    auVar1 = vandps_avx(auVar1,auVar61);
    auVar61 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar73,1);
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar61 = vandps_avx(auVar61,auVar76);
    auVar61 = vorps_avx(auVar61,auVar1);
    auVar62._8_4_ = 4;
    auVar62._0_8_ = 0x400000004;
    auVar62._12_4_ = 4;
    auVar1 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar73,1);
    auVar1 = vandps_avx(auVar1,auVar62);
    auVar52 = vpor_avx(auVar52 ^ auVar65,auVar1);
    local_2698 = vpor_avx(auVar52,auVar61);
    local_25e8 = *(float *)ray;
    fStack_25e4 = *(float *)(ray + 4);
    fStack_25e0 = *(float *)(ray + 8);
    fStack_25dc = *(float *)(ray + 0xc);
    fVar59 = local_25b8._0_4_ * -*(float *)ray;
    fVar66 = local_25b8._4_4_ * -*(float *)(ray + 4);
    fVar68 = local_25b8._8_4_ * -*(float *)(ray + 8);
    fVar70 = local_25b8._12_4_ * -*(float *)(ray + 0xc);
    local_25f8 = *(float *)(ray + 0x10);
    fStack_25f4 = *(float *)(ray + 0x14);
    fStack_25f0 = *(float *)(ray + 0x18);
    fStack_25ec = *(float *)(ray + 0x1c);
    fVar60 = local_25c8._0_4_ * -*(float *)(ray + 0x10);
    fVar67 = local_25c8._4_4_ * -*(float *)(ray + 0x14);
    fVar69 = local_25c8._8_4_ * -*(float *)(ray + 0x18);
    fVar71 = local_25c8._12_4_ * -*(float *)(ray + 0x1c);
    local_2608 = *(float *)(ray + 0x20);
    fStack_2604 = *(float *)(ray + 0x24);
    fStack_2600 = *(float *)(ray + 0x28);
    fStack_25fc = *(float *)(ray + 0x2c);
    local_2588 = local_25d8._0_4_ * -*(float *)(ray + 0x20);
    fStack_2584 = local_25d8._4_4_ * -*(float *)(ray + 0x24);
    fStack_2580 = local_25d8._8_4_ * -*(float *)(ray + 0x28);
    fStack_257c = local_25d8._12_4_ * -*(float *)(ray + 0x2c);
    local_25a8 = mm_lookupmask_ps._0_8_;
    uStack_25a0 = mm_lookupmask_ps._8_8_;
    local_2628 = 0x7f800000;
    uStack_2624 = 0x7f800000;
    uStack_2620 = 0x7f800000;
    uStack_261c = 0x7f800000;
    do {
      lVar17 = 0;
      for (uVar33 = uVar38; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar31 = *(undefined4 *)(local_2698 + lVar17 * 4);
      auVar52._4_4_ = uVar31;
      auVar52._0_4_ = uVar31;
      auVar52._8_4_ = uVar31;
      auVar52._12_4_ = uVar31;
      local_2748 = vpcmpeqd_avx(auVar52,local_2698);
      uVar31 = vmovmskps_avx(local_2748);
      uVar41 = CONCAT44((int)((ulong)lVar17 >> 0x20),uVar31);
      auVar77._8_4_ = 0x7f800000;
      auVar77._0_8_ = 0x7f8000007f800000;
      auVar77._12_4_ = 0x7f800000;
      auVar52 = vblendvps_avx(auVar77,auVar93._0_16_,local_2748);
      uVar38 = ~uVar41 & uVar38;
      auVar65 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar65,auVar52);
      auVar65 = vshufpd_avx(auVar52,auVar52,1);
      auVar65 = vminps_avx(auVar65,auVar52);
      auVar52 = vblendvps_avx(auVar77,auVar94._0_16_,local_2748);
      auVar1 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar1,auVar52);
      auVar1 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vminps_avx(auVar1,auVar52);
      auVar65 = vinsertps_avx(auVar65,auVar52,0x1c);
      auVar52 = vblendvps_avx(auVar77,auVar95._0_16_,local_2748);
      auVar1 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar1,auVar52);
      auVar1 = vshufpd_avx(auVar52,auVar52,1);
      auVar1 = vminps_avx(auVar1,auVar52);
      auVar91._8_4_ = 0xff800000;
      auVar91._0_8_ = 0xff800000ff800000;
      auVar91._12_4_ = 0xff800000;
      auVar52 = vblendvps_avx(auVar91,auVar93._0_16_,local_2748);
      auVar73 = vinsertps_avx(auVar65,auVar1,0x20);
      auVar65 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar65,auVar52);
      auVar65 = vshufpd_avx(auVar52,auVar52,1);
      auVar65 = vmaxps_avx(auVar65,auVar52);
      auVar52 = vblendvps_avx(auVar91,auVar94._0_16_,local_2748);
      auVar1 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar1,auVar52);
      auVar1 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vmaxps_avx(auVar1,auVar52);
      auVar65 = vinsertps_avx(auVar65,auVar52,0x1c);
      auVar52 = vblendvps_avx(auVar91,auVar95._0_16_,local_2748);
      auVar1 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar1,auVar52);
      auVar1 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vmaxps_avx(auVar1,auVar52);
      auVar76 = vinsertps_avx(auVar65,auVar52,0x20);
      auVar62 = vcmpps_avx(auVar73,ZEXT816(0) << 0x40,5);
      auVar52 = vblendvps_avx(auVar76,auVar73,auVar62);
      auVar5 = vmovshdup_avx(auVar52);
      uVar47 = (ulong)(auVar5._0_4_ < 0.0) << 5 | 0x40;
      auVar65 = vshufpd_avx(auVar52,auVar52,1);
      uVar45 = (ulong)(auVar65._0_4_ < 0.0) << 5 | 0x80;
      fVar90 = auVar52._0_4_;
      auVar19._4_4_ = fStack_25e4;
      auVar19._0_4_ = local_25e8;
      auVar19._8_4_ = fStack_25e0;
      auVar19._12_4_ = fStack_25dc;
      auVar65 = vblendvps_avx(auVar77,auVar19,local_2748);
      auVar1 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vminps_avx(auVar1,auVar65);
      auVar1 = vshufpd_avx(auVar65,auVar65,1);
      auVar1 = vminps_avx(auVar1,auVar65);
      auVar8._4_4_ = fStack_25f4;
      auVar8._0_4_ = local_25f8;
      auVar8._8_4_ = fStack_25f0;
      auVar8._12_4_ = fStack_25ec;
      auVar65 = vblendvps_avx(auVar77,auVar8,local_2748);
      auVar61 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vminps_avx(auVar61,auVar65);
      auVar61 = vshufpd_avx(auVar65,auVar65,1);
      auVar61 = vminps_avx(auVar61,auVar65);
      auVar7._4_4_ = fStack_2604;
      auVar7._0_4_ = local_2608;
      auVar7._8_4_ = fStack_2600;
      auVar7._12_4_ = fStack_25fc;
      auVar65 = vblendvps_avx(auVar77,auVar7,local_2748);
      auVar1 = vinsertps_avx(auVar1,auVar61,0x1c);
      auVar61 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vminps_avx(auVar61,auVar65);
      auVar61 = vshufpd_avx(auVar65,auVar65,1);
      auVar65 = vminps_avx(auVar61,auVar65);
      auVar1 = vinsertps_avx(auVar1,auVar65,0x20);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      auVar65 = vblendvps_avx(auVar53,auVar19,local_2748);
      auVar61 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vmaxps_avx(auVar61,auVar65);
      auVar61 = vshufpd_avx(auVar65,auVar65,1);
      auVar61 = vmaxps_avx(auVar61,auVar65);
      auVar65 = vblendvps_avx(auVar53,auVar8,local_2748);
      auVar80 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vmaxps_avx(auVar80,auVar65);
      auVar80 = vshufpd_avx(auVar65,auVar65,1);
      auVar80 = vmaxps_avx(auVar80,auVar65);
      auVar65 = vblendvps_avx(auVar53,auVar7,local_2748);
      auVar61 = vinsertps_avx(auVar61,auVar80,0x1c);
      auVar80 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar65 = vmaxps_avx(auVar80,auVar65);
      auVar80 = vshufpd_avx(auVar65,auVar65,1);
      auVar65 = vmaxps_avx(auVar80,auVar65);
      auVar61 = vinsertps_avx(auVar61,auVar65,0x20);
      auVar65 = vblendvps_avx(auVar61,auVar1,auVar62);
      auVar1 = vblendvps_avx(auVar1,auVar61,auVar62);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar53,local_2618,local_2748);
      auVar61 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
      auVar80 = vmaxps_avx(auVar61,(undefined1  [16])bi_8.field_0);
      auVar54._8_4_ = 0x7f800000;
      auVar54._0_8_ = 0x7f8000007f800000;
      auVar54._12_4_ = 0x7f800000;
      auVar61 = vblendvps_avx(auVar54,auVar3,local_2748);
      auVar7 = vshufpd_avx(auVar80,auVar80,1);
      auVar81 = vshufps_avx(auVar61,auVar61,0xb1);
      auVar61 = vminps_avx(auVar81,auVar61);
      auVar8 = vshufpd_avx(auVar61,auVar61,1);
      auVar81 = vminps_avx(auVar8,auVar61);
      auVar61 = vpcmpeqd_avx(auVar8,auVar8);
      auVar89 = ZEXT1664(auVar61);
      auVar80 = vmaxps_avx(auVar7,auVar80);
      auVar61 = vblendvps_avx(auVar73,auVar76,auVar62);
      auVar82._0_4_ = auVar1._0_4_ * fVar90;
      auVar82._4_4_ = auVar1._4_4_ * auVar52._4_4_;
      auVar82._8_4_ = auVar1._8_4_ * auVar52._8_4_;
      auVar82._12_4_ = auVar1._12_4_ * auVar52._12_4_;
      fVar6 = auVar61._0_4_;
      auVar78._0_4_ = auVar65._0_4_ * fVar6;
      auVar78._4_4_ = auVar65._4_4_ * auVar61._4_4_;
      auVar78._8_4_ = auVar65._8_4_ * auVar61._8_4_;
      auVar78._12_4_ = auVar65._12_4_ * auVar61._12_4_;
      uVar46 = (ulong)(fVar90 < 0.0) * 0x20;
      stack[0].ptr.ptr = *(size_t *)&pAVar2[1].bounds.bounds0.lower.field_0;
      stack[0].mask = uVar41;
      uVar33 = CONCAT44(auVar82._0_4_,auVar82._0_4_);
      auVar86._0_8_ = uVar33 ^ 0x8000000080000000;
      auVar86._8_4_ = -auVar82._0_4_;
      auVar86._12_4_ = -auVar82._0_4_;
      auVar86._16_4_ = -auVar82._0_4_;
      auVar86._20_4_ = -auVar82._0_4_;
      auVar86._24_4_ = -auVar82._0_4_;
      auVar86._28_4_ = -auVar82._0_4_;
      uVar72 = auVar5._0_8_;
      auVar65 = vmovshdup_avx(auVar82);
      uVar30 = auVar65._0_4_;
      uVar10 = auVar65._4_4_;
      auVar75._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
      auVar75._8_4_ = uVar30 ^ 0x80000000;
      auVar75._12_4_ = uVar10 ^ 0x80000000;
      auVar75._16_4_ = uVar30 ^ 0x80000000;
      auVar75._20_4_ = uVar10 ^ 0x80000000;
      auVar75._24_4_ = uVar30 ^ 0x80000000;
      auVar75._28_4_ = uVar10 ^ 0x80000000;
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      uVar49 = auVar52._0_8_;
      auVar65 = vshufps_avx(auVar82,auVar82,0xaa);
      uVar30 = auVar65._0_4_;
      uVar11 = auVar65._4_4_;
      auVar52 = vmovshdup_avx(auVar61);
      uVar50 = auVar52._0_8_;
      auVar52 = vmovshdup_avx(auVar78);
      uVar10 = auVar52._0_4_;
      uVar12 = auVar52._4_4_;
      auVar1 = vshufps_avx(auVar61,auVar61,0xaa);
      uVar51 = auVar1._0_8_;
      auVar1 = vshufps_avx(auVar78,auVar78,0xaa);
      uVar9 = auVar1._0_4_;
      uVar13 = auVar1._4_4_;
      uVar31 = auVar81._0_4_;
      uVar85 = auVar80._0_4_;
      auVar5._4_4_ = uStack_2624;
      auVar5._0_4_ = local_2628;
      auVar5._8_4_ = uStack_2620;
      auVar5._12_4_ = uStack_261c;
      local_2578 = vblendvps_avx(auVar5,auVar3,local_2748);
      auVar58 = ZEXT1664(local_2578);
      auVar92 = ZEXT1664(auVar92._0_16_);
      auVar87 = ZEXT1664(CONCAT412(fVar70,CONCAT48(fVar68,CONCAT44(fVar66,fVar59))));
      auVar88 = ZEXT1664(CONCAT412(fVar71,CONCAT48(fVar69,CONCAT44(fVar67,fVar60))));
      pSVar39 = stack + 1;
      do {
        auVar61 = auVar58._0_16_;
        auVar57 = auVar92._0_16_;
        if (pSVar39 == stack) break;
        pSVar36 = pSVar39 + -1;
        uVar32 = vmovmskps_avx(auVar57);
        uVar33 = ~CONCAT44((int)(uVar41 >> 0x20),uVar32) & pSVar39[-1].mask;
        if (uVar33 != 0) {
          sVar44 = (pSVar36->ptr).ptr;
LAB_00676c87:
          if ((sVar44 & 8) == 0) goto code_r0x00676c91;
          if (uVar33 != 0) {
            pGVar34 = (Geometry *)((ulong)((uint)sVar44 & 0xf) - 8);
            local_2650 = pGVar34;
            auVar61 = auVar57;
            if (pGVar34 != (Geometry *)0x0) {
              local_2598._0_4_ = auVar92._0_4_ ^ auVar89._0_4_;
              local_2598._4_4_ = auVar92._4_4_ ^ auVar89._4_4_;
              local_2598._8_4_ = auVar92._8_4_ ^ auVar89._8_4_;
              local_2598._12_4_ = auVar92._12_4_ ^ auVar89._12_4_;
              pGVar40 = (Geometry *)0x1;
              do {
                local_2680.geomID =
                     *(uint *)(((sVar44 & 0xfffffffffffffff0) - 8) + (long)pGVar40 * 8);
                local_2650 = (context->scene->geometries).items[local_2680.geomID].ptr;
                uVar37 = local_2650->mask;
                auVar56._4_4_ = uVar37;
                auVar56._0_4_ = uVar37;
                auVar56._8_4_ = uVar37;
                auVar56._12_4_ = uVar37;
                auVar61 = vpand_avx(auVar56,*(undefined1 (*) [16])(ray + 0x90));
                auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,auVar61);
                auVar62 = local_2598 & ~auVar61;
                auVar4._8_8_ = uStack_25a0;
                auVar4._0_8_ = local_25a8;
                auVar73 = local_2598;
                if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar62[0xf] < '\0') {
                  mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 vandnps_avx(auVar61,local_2598);
                  local_2680.primID =
                       *(uint *)(((sVar44 & 0xfffffffffffffff0) - 4) + (long)pGVar40 * 8);
                  local_2680.valid = (int *)&mask;
                  local_2680.geometryUserPtr = local_2650->userPtr;
                  local_2680.context = context->user;
                  local_2680.N = 4;
                  local_2648 = 0;
                  local_2640 = context->args;
                  p_Var35 = local_2640->intersect;
                  if (p_Var35 == (RTCIntersectFunctionN)0x0) {
                    p_Var35 = (RTCIntersectFunctionN)
                              local_2650[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i;
                  }
                  auVar61 = auVar89._0_16_;
                  local_2680.rayhit = (RTCRayHitN *)ray;
                  local_2650 = (Geometry *)(*p_Var35)(&local_2680);
                  auVar4 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0,1);
                  auVar61 = vpcmpeqd_avx(auVar61,auVar61);
                  auVar89 = ZEXT1664(auVar61);
                  auVar93 = ZEXT1664(local_25b8);
                  auVar94 = ZEXT1664(local_25c8);
                  auVar95 = ZEXT1664(local_25d8);
                  auVar92 = ZEXT1664(auVar57);
                  auVar87 = ZEXT1664(CONCAT412(fVar70,CONCAT48(fVar68,CONCAT44(fVar66,fVar59))));
                  auVar88 = ZEXT1664(CONCAT412(fVar71,CONCAT48(fVar69,CONCAT44(fVar67,fVar60))));
                  auVar73 = local_2598;
                }
                auVar61 = auVar92._0_16_;
                local_2598 = vandnps_avx(auVar4,auVar73);
                auVar73 = auVar73 & ~auVar4;
              } while (((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar73[0xf] < '\0') &&
                      (local_2650 = (Geometry *)
                                    ((long)&(pGVar40->super_RefCount)._vptr_RefCount + 1),
                      bVar48 = pGVar40 < pGVar34, pGVar40 = local_2650, bVar48));
              auVar57._0_4_ = auVar89._0_4_ ^ local_2598._0_4_;
              auVar57._4_4_ = auVar89._4_4_ ^ local_2598._4_4_;
              auVar57._8_4_ = auVar89._8_4_ ^ local_2598._8_4_;
              auVar57._12_4_ = auVar89._12_4_ ^ local_2598._12_4_;
            }
            auVar62 = vorps_avx(auVar61,auVar57);
            auVar92 = ZEXT1664(auVar62);
            auVar61 = vandnps_avx(auVar62,local_2748);
            auVar58 = ZEXT1664(auVar61);
            auVar73 = local_2748 & ~auVar62;
            local_2748 = auVar61;
            if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar73[0xf]) {
              uVar41 = CONCAT71((int7)((ulong)local_2650 >> 8),1);
            }
            else {
              auVar64._8_4_ = 0xff800000;
              auVar64._0_8_ = 0xff800000ff800000;
              auVar64._12_4_ = 0xff800000;
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             vblendvps_avx((undefined1  [16])bi_8.field_0,auVar64,auVar62);
              uVar41 = 0;
            }
            goto LAB_00677061;
          }
        }
LAB_0067705f:
        uVar41 = 0;
LAB_00677061:
        auVar61 = auVar58._0_16_;
        pSVar39 = pSVar36;
      } while ((char)uVar41 == '\0');
    } while (uVar38 != 0);
    auVar52 = vpcmpeqd_avx(auVar61,auVar61);
    auVar52 = vpcmpeqd_avx(auVar52,(undefined1  [16])local_2638);
    auVar52 = vpand_avx(auVar92._0_16_,auVar52);
    auVar65._8_4_ = 0xff800000;
    auVar65._0_8_ = 0xff800000ff800000;
    auVar65._12_4_ = 0xff800000;
    auVar52 = vmaskmovps_avx(auVar52,auVar65);
    *(undefined1 (*) [16])(ray + 0x80) = auVar52;
  }
  return;
code_r0x00676c91:
  auVar29._4_4_ = fVar90;
  auVar29._0_4_ = fVar90;
  auVar29._8_4_ = fVar90;
  auVar29._12_4_ = fVar90;
  auVar29._16_4_ = fVar90;
  auVar29._20_4_ = fVar90;
  auVar29._24_4_ = fVar90;
  auVar29._28_4_ = fVar90;
  auVar61 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + uVar46),auVar86,auVar29);
  auVar14._8_8_ = uVar72;
  auVar14._0_8_ = uVar72;
  auVar14._16_8_ = uVar72;
  auVar14._24_8_ = uVar72;
  auVar62 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + uVar47),auVar75,auVar14);
  auVar14 = vpmaxsd_avx2(ZEXT1632(auVar61),ZEXT1632(auVar62));
  auVar27._8_4_ = uVar30 ^ 0x80000000;
  auVar27._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
  auVar27._12_4_ = uVar11 ^ 0x80000000;
  auVar27._16_4_ = uVar30 ^ 0x80000000;
  auVar27._20_4_ = uVar11 ^ 0x80000000;
  auVar27._24_4_ = uVar30 ^ 0x80000000;
  auVar27._28_4_ = uVar11 ^ 0x80000000;
  auVar28._8_8_ = uVar49;
  auVar28._0_8_ = uVar49;
  auVar28._16_8_ = uVar49;
  auVar28._24_8_ = uVar49;
  auVar61 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + uVar45),auVar27,auVar28);
  auVar15._4_4_ = uVar31;
  auVar15._0_4_ = uVar31;
  auVar15._8_4_ = uVar31;
  auVar15._12_4_ = uVar31;
  auVar15._16_4_ = uVar31;
  auVar15._20_4_ = uVar31;
  auVar15._24_4_ = uVar31;
  auVar15._28_4_ = uVar31;
  auVar15 = vpmaxsd_avx2(ZEXT1632(auVar61),auVar15);
  auVar14 = vpmaxsd_avx2(auVar14,auVar15);
  uVar41 = CONCAT44(auVar78._0_4_,auVar78._0_4_);
  auVar25._8_4_ = -auVar78._0_4_;
  auVar25._0_8_ = uVar41 ^ 0x8000000080000000;
  auVar25._12_4_ = -auVar78._0_4_;
  auVar25._16_4_ = -auVar78._0_4_;
  auVar25._20_4_ = -auVar78._0_4_;
  auVar25._24_4_ = -auVar78._0_4_;
  auVar25._28_4_ = -auVar78._0_4_;
  auVar26._4_4_ = fVar6;
  auVar26._0_4_ = fVar6;
  auVar26._8_4_ = fVar6;
  auVar26._12_4_ = fVar6;
  auVar26._16_4_ = fVar6;
  auVar26._20_4_ = fVar6;
  auVar26._24_4_ = fVar6;
  auVar26._28_4_ = fVar6;
  auVar61 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + (uVar46 ^ 0x20)),auVar25,auVar26)
  ;
  auVar23._8_4_ = uVar10 ^ 0x80000000;
  auVar23._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
  auVar23._12_4_ = uVar12 ^ 0x80000000;
  auVar23._16_4_ = uVar10 ^ 0x80000000;
  auVar23._20_4_ = uVar12 ^ 0x80000000;
  auVar23._24_4_ = uVar10 ^ 0x80000000;
  auVar23._28_4_ = uVar12 ^ 0x80000000;
  auVar24._8_8_ = uVar50;
  auVar24._0_8_ = uVar50;
  auVar24._16_8_ = uVar50;
  auVar24._24_8_ = uVar50;
  auVar62 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + (uVar47 ^ 0x20)),auVar23,auVar24)
  ;
  auVar15 = vpminsd_avx2(ZEXT1632(auVar61),ZEXT1632(auVar62));
  auVar21._8_4_ = uVar9 ^ 0x80000000;
  auVar21._0_8_ = auVar1._0_8_ ^ 0x8000000080000000;
  auVar21._12_4_ = uVar13 ^ 0x80000000;
  auVar21._16_4_ = uVar9 ^ 0x80000000;
  auVar21._20_4_ = uVar13 ^ 0x80000000;
  auVar21._24_4_ = uVar9 ^ 0x80000000;
  auVar21._28_4_ = uVar13 ^ 0x80000000;
  auVar22._8_8_ = uVar51;
  auVar22._0_8_ = uVar51;
  auVar22._16_8_ = uVar51;
  auVar22._24_8_ = uVar51;
  auVar61 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar44 + 0x40 + (uVar45 ^ 0x20)),auVar21,auVar22)
  ;
  auVar16._4_4_ = uVar85;
  auVar16._0_4_ = uVar85;
  auVar16._8_4_ = uVar85;
  auVar16._12_4_ = uVar85;
  auVar16._16_4_ = uVar85;
  auVar16._20_4_ = uVar85;
  auVar16._24_4_ = uVar85;
  auVar16._28_4_ = uVar85;
  auVar16 = vpminsd_avx2(ZEXT1632(auVar61),auVar16);
  auVar15 = vpminsd_avx2(auVar15,auVar16);
  auVar14 = vcmpps_avx(auVar14,auVar15,2);
  auVar58 = ZEXT3264(auVar14);
  uVar37 = vmovmskps_avx(auVar14);
  if (uVar37 == 0) {
    bVar48 = false;
  }
  else {
    uVar41 = (ulong)(uVar37 & 0xff);
    uVar33 = 0;
    sVar42 = 8;
    do {
      lVar17 = 0;
      for (uVar18 = uVar41; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar32 = *(undefined4 *)(sVar44 + 0x40 + lVar17 * 4);
      auVar55._4_4_ = uVar32;
      auVar55._0_4_ = uVar32;
      auVar55._8_4_ = uVar32;
      auVar55._12_4_ = uVar32;
      auVar73 = vfmadd213ps_fma(auVar55,auVar93._0_16_,auVar87._0_16_);
      uVar32 = *(undefined4 *)(sVar44 + 0x80 + lVar17 * 4);
      auVar63._4_4_ = uVar32;
      auVar63._0_4_ = uVar32;
      auVar63._8_4_ = uVar32;
      auVar63._12_4_ = uVar32;
      auVar76 = vfmadd213ps_fma(auVar63,auVar94._0_16_,auVar88._0_16_);
      uVar32 = *(undefined4 *)(sVar44 + 0xc0 + lVar17 * 4);
      auVar74._4_4_ = uVar32;
      auVar74._0_4_ = uVar32;
      auVar74._8_4_ = uVar32;
      auVar74._12_4_ = uVar32;
      auVar20._4_4_ = fStack_2584;
      auVar20._0_4_ = local_2588;
      auVar20._8_4_ = fStack_2580;
      auVar20._12_4_ = fStack_257c;
      auVar80 = vfmadd213ps_fma(auVar74,auVar95._0_16_,auVar20);
      uVar32 = *(undefined4 *)(sVar44 + 0x60 + lVar17 * 4);
      auVar79._4_4_ = uVar32;
      auVar79._0_4_ = uVar32;
      auVar79._8_4_ = uVar32;
      auVar79._12_4_ = uVar32;
      auVar81 = vfmadd213ps_fma(auVar79,auVar93._0_16_,auVar87._0_16_);
      uVar32 = *(undefined4 *)(sVar44 + 0xa0 + lVar17 * 4);
      auVar83._4_4_ = uVar32;
      auVar83._0_4_ = uVar32;
      auVar83._8_4_ = uVar32;
      auVar83._12_4_ = uVar32;
      auVar5 = vfmadd213ps_fma(auVar83,auVar94._0_16_,auVar88._0_16_);
      uVar32 = *(undefined4 *)(sVar44 + 0xe0 + lVar17 * 4);
      auVar84._4_4_ = uVar32;
      auVar84._0_4_ = uVar32;
      auVar84._8_4_ = uVar32;
      auVar84._12_4_ = uVar32;
      auVar7 = vfmadd213ps_fma(auVar84,auVar95._0_16_,auVar20);
      auVar61 = vpminsd_avx(auVar73,auVar81);
      auVar62 = vpminsd_avx(auVar76,auVar5);
      auVar61 = vpmaxsd_avx(auVar61,auVar62);
      auVar62 = vpminsd_avx(auVar80,auVar7);
      auVar62 = vpmaxsd_avx(auVar62,local_2578);
      auVar61 = vpmaxsd_avx(auVar61,auVar62);
      auVar62 = vpmaxsd_avx(auVar73,auVar81);
      auVar73 = vpmaxsd_avx(auVar76,auVar5);
      auVar73 = vpminsd_avx(auVar62,auVar73);
      auVar62 = vpmaxsd_avx(auVar80,auVar7);
      auVar62 = vpminsd_avx(auVar62,(undefined1  [16])bi_8.field_0);
      auVar62 = vpminsd_avx(auVar73,auVar62);
      auVar61 = vcmpps_avx(auVar61,auVar62,2);
      auVar58 = ZEXT1664(auVar61);
      uVar37 = vmovmskps_avx(auVar61);
      sVar43 = sVar42;
      if (uVar37 != 0) {
        sVar43 = *(size_t *)(sVar44 + lVar17 * 8);
        if (sVar42 != 8) {
          (pSVar36->ptr).ptr = sVar42;
          pSVar36->mask = uVar33;
          pSVar36 = pSVar36 + 1;
        }
        uVar33 = (ulong)(uVar37 & 0xff);
      }
      uVar41 = uVar41 - 1 & uVar41;
      sVar42 = sVar43;
    } while (uVar41 != 0);
    bVar48 = sVar43 != 8;
    sVar44 = sVar43;
  }
  if (!bVar48) goto LAB_0067705f;
  goto LAB_00676c87;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }